

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall
brynet::net::ConnectorWorkInfo::processConnect(ConnectorWorkInfo *this,AsyncConnectAddr *addr)

{
  ushort uVar1;
  sock fd;
  int iVar2;
  int *piVar3;
  mapped_type *this_00;
  sock local_8c;
  undefined1 local_88 [8];
  sockaddr_in server_addr;
  ConnectingInfo local_70;
  
  base::InitSocket();
  fd = base::SocketCreate(2,1,0);
  local_8c = fd;
  if (fd != -1) {
    base::SocketNonblock(fd);
    server_addr.sin_family = 2;
    inet_pton(2,(addr->mIP)._M_dataplus._M_p,&server_addr.sin_addr);
    uVar1 = (ushort)addr->mPort;
    server_addr.sin_port = uVar1 << 8 | uVar1 >> 8;
    iVar2 = connect(fd,(sockaddr *)&server_addr,0x10);
    if (iVar2 == 0) {
      if ((addr->mSuccessCB).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      TcpSocket::Create((TcpSocket *)local_88,fd,false);
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::operator()(&addr->mSuccessCB,
                   (unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter> *)
                   local_88);
      if (local_88 == (undefined1  [8])0x0) {
        return;
      }
      (**(code **)(*(_func_int **)local_88 + 8))();
      return;
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0x73) {
      local_70.failedCB.super__Function_base._M_functor._8_8_ = 0;
      local_70.failedCB.super__Function_base._M_manager = (_Manager_type)0x0;
      local_70.successCB._M_invoker = (_Invoker_type)0x0;
      local_70.failedCB.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_70.successCB.super__Function_base._M_functor._8_8_ = 0;
      local_70.successCB.super__Function_base._M_manager = (_Manager_type)0x0;
      local_70.timeout.__r = 0;
      local_70.successCB.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_70.failedCB._M_invoker = (_Invoker_type)0x0;
      local_70.startConnectTime.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::operator=(&local_70.successCB,&addr->mSuccessCB);
      std::function<void_()>::operator=(&local_70.failedCB,&addr->mFailedCB);
      local_70.timeout.__r = (addr->mTimeout).__r;
      this_00 = std::
                map<int,_brynet::net::ConnectorWorkInfo::ConnectingInfo,_std::less<int>,_std::allocator<std::pair<const_int,_brynet::net::ConnectorWorkInfo::ConnectingInfo>_>_>
                ::operator[](&this->mConnectingInfos,&local_8c);
      ConnectingInfo::operator=(this_00,&local_70);
      ox_fdset_add((this->mFDSet)._M_t.
                   super___uniq_ptr_impl<fdset_s,_brynet::net::ConnectorWorkInfo::FDSetDeleter>._M_t
                   .super__Tuple_impl<0UL,_fdset_s_*,_brynet::net::ConnectorWorkInfo::FDSetDeleter>.
                   super__Head_base<0UL,_fdset_s_*,_false>._M_head_impl,local_8c,2);
      ConnectingInfo::~ConnectingInfo(&local_70);
      return;
    }
    base::SocketClose(fd);
  }
  if ((addr->mFailedCB).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_()>::operator()(&addr->mFailedCB);
  }
  return;
}

Assistant:

void ConnectorWorkInfo::processConnect(const AsyncConnectAddr& addr)
{
    struct sockaddr_in server_addr;
    sock clientfd = SOCKET_ERROR;

#if defined PLATFORM_WINDOWS
    int check_error = WSAEWOULDBLOCK;
#else
    int check_error = EINPROGRESS;
#endif
    int n = 0;

    brynet::net::base::InitSocket();

    clientfd = brynet::net::base::SocketCreate(AF_INET, SOCK_STREAM, 0);
    if (clientfd == SOCKET_ERROR)
    {
        goto FAILED;
    }

    brynet::net::base::SocketNonblock(clientfd);
    server_addr.sin_family = AF_INET;
    inet_pton(AF_INET, addr.getIP().c_str(), &server_addr.sin_addr.s_addr);
    server_addr.sin_port = htons(addr.getPort());

    n = connect(clientfd, (struct sockaddr*)&server_addr, sizeof(struct sockaddr));
    if (n == 0)
    {
        goto SUCCESS;
    }

    if (check_error != sErrno)
    {
        brynet::net::base::SocketClose(clientfd);
        clientfd = SOCKET_ERROR;
        goto FAILED;
    }

    {
        ConnectingInfo ci;
        ci.startConnectTime = std::chrono::steady_clock::now();
        ci.successCB = addr.getSuccessCB();
        ci.failedCB = addr.getFailedCB();
        ci.timeout = addr.getTimeout();

        mConnectingInfos[clientfd] = ci;
        ox_fdset_add(mFDSet.get(), clientfd, WriteCheck);
    }
    return;

SUCCESS:
    if (addr.getSuccessCB() != nullptr)
    {
        addr.getSuccessCB()(TcpSocket::Create(clientfd, false));
    }
    return;

FAILED:
    if (addr.getFailedCB() != nullptr)
    {
        addr.getFailedCB()();
    }
}